

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODRowReader.h
# Opt level: O0

int ZXing::OneD::RowReader::
    DecodeDigit<ZXing::PatternView,std::array<ZXing::FixedPattern<5,15,false>,6ul>>
              (PatternView *counters,array<ZXing::FixedPattern<5,_15,_false>,_6UL> *patterns,
              float maxAvgVariance,float maxIndividualVariance,bool requireUnambiguousMatch)

{
  float fVar1;
  int iVar2;
  byte in_DL;
  array<ZXing::FixedPattern<5,_15,_false>,_6UL> *in_RDI;
  float in_XMM0_Da;
  float variance;
  int i;
  int bestMatch;
  int INVALID_MATCH;
  float bestVariance;
  size_type in_stack_ffffffffffffffb8;
  array<ZXing::FixedPattern<5,_15,_false>,_6UL> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffd0;
  int iVar3;
  int iVar4;
  int local_28;
  float local_20;
  
  local_28 = -1;
  iVar3 = 0;
  local_20 = in_XMM0_Da;
  while (iVar4 = iVar3,
        iVar2 = Size<std::array<ZXing::FixedPattern<5,15,false>,6ul>>(in_stack_ffffffffffffffc0),
        iVar3 < iVar2) {
    in_stack_ffffffffffffffc0 = in_RDI;
    std::array<ZXing::FixedPattern<5,_15,_false>,_6UL>::operator[](in_RDI,in_stack_ffffffffffffffb8)
    ;
    in_stack_ffffffffffffffd0 =
         PatternMatchVariance<ZXing::PatternView,ZXing::FixedPattern<5,15,false>>
                   ((PatternView *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                    (FixedPattern<5,_15,_false> *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
                    (float)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    iVar3 = iVar4;
    fVar1 = in_stack_ffffffffffffffd0;
    if ((local_20 <= in_stack_ffffffffffffffd0) &&
       (iVar3 = local_28, fVar1 = local_20, (in_DL & 1) != 0)) {
      if ((in_stack_ffffffffffffffd0 == local_20) &&
         (!NAN(in_stack_ffffffffffffffd0) && !NAN(local_20))) {
        local_28 = -1;
        iVar3 = local_28;
      }
    }
    local_20 = fVar1;
    local_28 = iVar3;
    iVar3 = iVar4 + 1;
  }
  return local_28;
}

Assistant:

static int DecodeDigit(const Counters& counters, const Patterns& patterns, float maxAvgVariance,
						   float maxIndividualVariance, bool requireUnambiguousMatch = true)
	{
		float bestVariance = maxAvgVariance; // worst variance we'll accept
		constexpr int INVALID_MATCH = -1;
		int bestMatch = INVALID_MATCH;
		for (int i = 0; i < Size(patterns); i++) {
			float variance = PatternMatchVariance(counters, patterns[i], maxIndividualVariance);
			if (variance < bestVariance) {
				bestVariance = variance;
				bestMatch = i;
			} else if (requireUnambiguousMatch && variance == bestVariance) {
				// if we find a second 'best match' with the same variance, we can not reliably report to have a suitable match
				bestMatch = INVALID_MATCH;
			}
		}
		return bestMatch;
	}